

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

EVaction INT_REVassoc_multi_action(CMConnection conn,EVstone stone,char *action_spec)

{
  int condition;
  CMFormat format;
  EV_int_response response;
  int local_40;
  EVstone local_3c;
  char *local_38;
  undefined1 local_30 [4];
  EVaction local_2c;
  
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVassoc_multi_action_req_formats);
  local_40 = condition;
  local_3c = stone;
  local_38 = action_spec;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVassoc_multi_action_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_30);
  INT_CMwrite(conn,format,&local_40);
  INT_CMCondition_wait(conn->cm,condition);
  return local_2c;
}

Assistant:

extern EVaction
INT_REVassoc_multi_action(CMConnection conn, EVstone stone, char *action_spec)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVassoc_multi_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVassoc_multi_action_req_formats);
    request.stone = stone;
    request.action_spec = action_spec;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVassoc_multi_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVaction) response.ret;
}